

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesNH4
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command_conflict *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ushort uVar4;
  BrotliDictionary *pBVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  ushort uVar9;
  uint32_t uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int *piVar14;
  ulong uVar15;
  uint8_t *puVar16;
  ulong uVar17;
  byte bVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  uint8_t uVar31;
  uint uVar32;
  ulong uVar33;
  long lVar34;
  uint *puVar35;
  ulong uVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  bool bVar40;
  ulong local_118;
  ulong local_110;
  size_t local_100;
  ulong local_f0;
  int local_e4;
  ulong local_e0;
  long local_d0;
  Command_conflict *local_c0;
  ulong local_98;
  uint local_58;
  
  local_100 = *last_insert_len;
  uVar23 = position + num_bytes;
  uVar12 = (position - 7) + num_bytes;
  if (num_bytes < 8) {
    uVar12 = position;
  }
  lVar34 = 0x200;
  if (params->quality < 9) {
    lVar34 = 0x40;
  }
  if (uVar23 <= position + 8) {
    local_c0 = commands;
LAB_001107b0:
    *last_insert_len = (local_100 + uVar23) - position;
    *num_commands = *num_commands + ((long)local_c0 - (long)commands >> 4);
    return;
  }
  uVar38 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  local_98 = lVar34 + position;
  uVar1 = uVar23 - 7;
  lVar3 = position - 1;
  local_c0 = commands;
  uVar17 = position;
LAB_0010f8af:
  uVar25 = uVar23 - uVar17;
  uVar19 = uVar38;
  if (uVar17 < uVar38) {
    uVar19 = uVar17;
  }
  uVar13 = uVar17 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar13);
  uVar31 = ringbuffer[uVar13];
  local_f0 = (ulong)*dist_cache;
  local_e0 = 0x7e4;
  local_58 = (uint)ringbuffer_mask;
  if ((uVar17 - local_f0 < uVar17) &&
     (uVar15 = (ulong)((uint)(uVar17 - local_f0) & local_58), uVar31 == ringbuffer[uVar15])) {
    if (7 < uVar25) {
      local_118 = uVar25 & 0xfffffffffffffff8;
      piVar14 = (int *)(ringbuffer + local_118 + uVar13);
      lVar26 = 0;
      uVar29 = 0;
LAB_0010f937:
      if (*(ulong *)(piVar2 + uVar29 * 2) == *(ulong *)(ringbuffer + uVar29 * 8 + uVar15))
      goto code_r0x0010f944;
      uVar29 = *(ulong *)(ringbuffer + uVar29 * 8 + uVar15) ^ *(ulong *)(piVar2 + uVar29 * 2);
      uVar15 = 0;
      if (uVar29 != 0) {
        for (; (uVar29 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
        }
      }
      uVar29 = (uVar15 >> 3 & 0x1fffffff) - lVar26;
      goto LAB_0010f982;
    }
    local_118 = 0;
    piVar14 = piVar2;
LAB_0011071a:
    uVar24 = uVar25 & 7;
    uVar29 = local_118;
    if (uVar24 != 0) {
      uVar36 = local_118 | uVar24;
      do {
        uVar29 = local_118;
        if (ringbuffer[local_118 + uVar15] != (uint8_t)*piVar14) break;
        piVar14 = (int *)((long)piVar14 + 1);
        local_118 = local_118 + 1;
        uVar24 = uVar24 - 1;
        uVar29 = uVar36;
      } while (uVar24 != 0);
    }
LAB_0010f982:
    if ((uVar29 < 4) || (uVar15 = uVar29 * 0x87 + 0x78f, uVar15 < 0x7e5)) goto LAB_0010f9ad;
    uVar31 = *(uint8_t *)((long)piVar2 + uVar29);
    local_e0 = uVar15;
  }
  else {
LAB_0010f9ad:
    local_f0 = 0;
    uVar29 = 0;
  }
  uVar15 = (params->dist).max_distance;
  lVar26 = *(long *)(ringbuffer + uVar13);
  puVar35 = (uint *)(hasher + ((ulong)(lVar26 * -0x42e1ca5843000000) >> 0x2f) * 4 + 0x28);
  uVar24 = (ulong)((uint)uVar25 & 7);
  iVar22 = 0;
  local_118 = uVar29;
  do {
    uVar32 = *puVar35;
    uVar37 = local_58 & uVar32;
    if (((uVar31 == ringbuffer[local_118 + uVar37]) && (uVar17 != uVar32)) &&
       (uVar29 = uVar17 - uVar32, uVar29 <= uVar19)) {
      if (7 < uVar25) {
        lVar27 = 0;
        uVar36 = 0;
LAB_0010fa4f:
        if (*(ulong *)(piVar2 + uVar36 * 2) == *(ulong *)(ringbuffer + uVar36 * 8 + (ulong)uVar37))
        goto code_r0x0010fa5d;
        uVar33 = *(ulong *)(ringbuffer + uVar36 * 8 + (ulong)uVar37) ^
                 *(ulong *)(piVar2 + uVar36 * 2);
        uVar36 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
          }
        }
        uVar36 = (uVar36 >> 3 & 0x1fffffff) - lVar27;
        goto LAB_0010fa97;
      }
      piVar14 = piVar2;
      uVar33 = 0;
LAB_0010faed:
      uVar36 = uVar33;
      if (uVar24 != 0) {
        uVar30 = uVar24 | uVar33;
        uVar39 = uVar24;
        do {
          uVar36 = uVar33;
          if (ringbuffer[uVar33 + uVar37] != (uint8_t)*piVar14) break;
          piVar14 = (int *)((long)piVar14 + 1);
          uVar33 = uVar33 + 1;
          uVar39 = uVar39 - 1;
          uVar36 = uVar30;
        } while (uVar39 != 0);
      }
LAB_0010fa97:
      if (3 < uVar36) {
        iVar6 = 0x1f;
        if ((uint)uVar29 != 0) {
          for (; (uint)uVar29 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        uVar33 = (ulong)(iVar6 * -0x1e + 0x780) + uVar36 * 0x87;
        if (local_e0 < uVar33) {
          uVar31 = *(uint8_t *)((long)piVar2 + uVar36);
          local_118 = uVar36;
          local_f0 = uVar29;
          local_e0 = uVar33;
        }
      }
    }
    puVar35 = puVar35 + 1;
    iVar22 = iVar22 + 1;
  } while (iVar22 != 4);
  local_e4 = 0;
  if ((local_e0 == 0x7e4) && (*(ulong *)(hasher + 0x18) >> 7 <= *(ulong *)(hasher + 0x20))) {
    uVar4 = (params->dictionary).hash_table[(ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x12) * 2];
    *(long *)(hasher + 0x18) = *(long *)(hasher + 0x18) + 1;
    if ((ulong)uVar4 == 0) goto LAB_0010fbfe;
    uVar32 = uVar4 & 0x1f;
    uVar13 = (ulong)uVar32;
    bVar40 = true;
    local_e4 = 0;
    if (uVar13 <= uVar25) {
      pBVar5 = (params->dictionary).words;
      puVar16 = pBVar5->data + (ulong)pBVar5->offsets_by_length[uVar13] + uVar13 * (uVar4 >> 5);
      if (7 < uVar13) {
        uVar24 = (ulong)(uVar4 & 0x18);
        lVar27 = 0;
        uVar29 = 0;
LAB_001102ad:
        if (*(ulong *)(puVar16 + uVar29 * 8) == *(ulong *)(piVar2 + uVar29 * 2))
        goto code_r0x001102ba;
        uVar24 = *(ulong *)(piVar2 + uVar29 * 2) ^ *(ulong *)(puVar16 + uVar29 * 8);
        uVar29 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        uVar29 = (uVar29 >> 3 & 0x1fffffff) - lVar27;
        goto LAB_0011030a;
      }
      uVar24 = 0;
      goto LAB_00110765;
    }
    goto LAB_0010fbb4;
  }
  goto LAB_0010fbfe;
code_r0x0010f944:
  uVar29 = uVar29 + 1;
  lVar26 = lVar26 + -8;
  if (uVar25 >> 3 == uVar29) goto LAB_0011071a;
  goto LAB_0010f937;
code_r0x0010fa5d:
  uVar36 = uVar36 + 1;
  lVar27 = lVar27 + -8;
  piVar14 = (int *)(ringbuffer + (uVar25 & 0xfffffffffffffff8) + uVar13);
  uVar33 = uVar25 & 0xfffffffffffffff8;
  if (uVar25 >> 3 == uVar36) goto LAB_0010faed;
  goto LAB_0010fa4f;
code_r0x001102ba:
  uVar29 = uVar29 + 1;
  lVar27 = lVar27 + -8;
  if (uVar32 >> 3 == uVar29) goto code_r0x001102c6;
  goto LAB_001102ad;
code_r0x001102c6:
  puVar16 = puVar16 + -lVar27;
LAB_00110765:
  uVar36 = (ulong)uVar4 & 7;
  uVar29 = uVar24;
  if ((uVar4 & 7) != 0) {
    uVar33 = uVar24 | uVar36;
    do {
      uVar29 = uVar24;
      if (*(uint8_t *)((long)piVar2 + uVar24) != *puVar16) break;
      puVar16 = puVar16 + 1;
      uVar24 = uVar24 + 1;
      uVar36 = uVar36 - 1;
      uVar29 = uVar33;
    } while (uVar36 != 0);
  }
LAB_0011030a:
  bVar8 = true;
  bVar40 = true;
  if (((uVar29 != 0) &&
      (bVar40 = bVar8, uVar13 < (params->dictionary).cutoffTransformsCount + uVar29)) &&
     (uVar19 = uVar19 + 1 + (ulong)(uVar4 >> 5) +
               ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                              ((char)(uVar13 - uVar29) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar13 - uVar29) * 4 << (pBVar5->size_bits_by_length[uVar13] & 0x3f)),
     uVar19 <= uVar15)) {
    iVar22 = 0x1f;
    if ((uint)uVar19 != 0) {
      for (; (uint)uVar19 >> iVar22 == 0; iVar22 = iVar22 + -1) {
      }
    }
    uVar13 = (uVar29 * 0x87 - (ulong)(uint)(iVar22 * 0x1e)) + 0x780;
    if (0x7e3 < uVar13) {
      local_e4 = uVar32 - (int)uVar29;
      local_f0 = uVar19;
      bVar40 = false;
      local_118 = uVar29;
      local_e0 = uVar13;
    }
  }
LAB_0010fbb4:
  if (!bVar40) {
    *(long *)(hasher + 0x20) = *(long *)(hasher + 0x20) + 1;
  }
LAB_0010fbfe:
  *(int *)(hasher + (ulong)((uint)((ulong)(lVar26 * -0x42e1ca5843000000) >> 0x2f) +
                           ((uint)(uVar17 >> 3) & 3)) * 4 + 0x28) = (int)uVar17;
  if (0x7e4 < local_e0) {
    iVar22 = *dist_cache;
    uVar19 = (lVar3 + num_bytes) - uVar17;
    iVar6 = 0;
LAB_0010fc3b:
    uVar25 = uVar25 - 1;
    uVar13 = local_118 - 1;
    if (uVar25 <= local_118 - 1) {
      uVar13 = uVar25;
    }
    if (4 < params->quality) {
      uVar13 = 0;
    }
    uVar29 = uVar17 + 1;
    uVar24 = uVar38;
    if (uVar29 < uVar38) {
      uVar24 = uVar29;
    }
    piVar2 = (int *)(ringbuffer + (uVar29 & ringbuffer_mask));
    uVar31 = *(uint8_t *)(uVar13 + (long)piVar2);
    uVar33 = uVar29 - (long)iVar22;
    uVar36 = 0x7e4;
    if ((uVar33 < uVar29) &&
       (uVar32 = (uint)uVar33 & local_58, uVar31 == ringbuffer[uVar13 + uVar32])) {
      if (7 < uVar25) {
        lVar26 = 0;
        uVar33 = 0;
LAB_0010fcc8:
        if (*(ulong *)(piVar2 + uVar33 * 2) == *(ulong *)(ringbuffer + uVar33 * 8 + (ulong)uVar32))
        goto code_r0x0010fcd5;
        uVar39 = *(ulong *)(ringbuffer + uVar33 * 8 + (ulong)uVar32) ^
                 *(ulong *)(piVar2 + uVar33 * 2);
        uVar33 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
          }
        }
        uVar33 = (uVar33 >> 3 & 0x1fffffff) - lVar26;
        goto LAB_0010fd04;
      }
      uVar33 = 0;
      piVar14 = piVar2;
      goto LAB_001100de;
    }
    goto LAB_0010fd3e;
  }
  local_100 = local_100 + 1;
  position = uVar17 + 1;
  if (local_98 < position) {
    if ((uint)((int)lVar34 * 4) + local_98 < position) {
      uVar19 = uVar17 + 0x11;
      if (uVar1 <= uVar17 + 0x11) {
        uVar19 = uVar1;
      }
      for (; position < uVar19; position = position + 4) {
        *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)
                                                          ) * -0x42e1ca5843000000) >> 0x2f) +
                                 ((uint)(position >> 3) & 3)) * 4 + 0x28) = (int)position;
        local_100 = local_100 + 4;
      }
    }
    else {
      uVar19 = uVar17 + 9;
      if (uVar1 <= uVar17 + 9) {
        uVar19 = uVar1;
      }
      for (; position < uVar19; position = position + 2) {
        *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)
                                                          ) * -0x42e1ca5843000000) >> 0x2f) +
                                 ((uint)(position >> 3) & 3)) * 4 + 0x28) = (int)position;
        local_100 = local_100 + 2;
      }
    }
  }
  goto LAB_00110682;
code_r0x0010fcd5:
  uVar33 = uVar33 + 1;
  lVar26 = lVar26 + -8;
  if (uVar19 >> 3 == uVar33) goto code_r0x0010fce3;
  goto LAB_0010fcc8;
code_r0x0010fce3:
  uVar33 = -lVar26;
  piVar14 = (int *)((long)piVar2 - lVar26);
LAB_001100de:
  uVar39 = uVar25 & 7;
  for (; (uVar39 != 0 && (ringbuffer[uVar33 + uVar32] == (uint8_t)*piVar14)); uVar33 = uVar33 + 1) {
    piVar14 = (int *)((long)piVar14 + 1);
    uVar39 = uVar39 - 1;
  }
LAB_0010fd04:
  if (uVar33 < 4) {
    local_110 = 0;
  }
  else {
    uVar39 = uVar33 * 0x87 + 0x78f;
    if (uVar39 < 0x7e5) {
LAB_0010fd3e:
      local_110 = 0;
    }
    else {
      uVar31 = *(uint8_t *)((long)piVar2 + uVar33);
      uVar36 = uVar39;
      uVar13 = uVar33;
      local_110 = (long)iVar22;
    }
  }
  lVar26 = *(long *)(ringbuffer + (uVar29 & ringbuffer_mask));
  puVar35 = (uint *)(hasher + ((ulong)(lVar26 * -0x42e1ca5843000000) >> 0x2f) * 4 + 0x28);
  uVar33 = (ulong)((uint)uVar25 & 7);
  iVar28 = 0;
LAB_0010fd80:
  uVar32 = *puVar35;
  uVar37 = local_58 & uVar32;
  if (((uVar31 == ringbuffer[uVar13 + uVar37]) && (uVar29 != uVar32)) &&
     (uVar39 = uVar29 - uVar32, uVar39 <= uVar24)) {
    uVar30 = uVar33;
    if (7 < uVar25) {
      lVar27 = 0;
      uVar20 = 0;
LAB_0010fdc0:
      if (*(ulong *)(piVar2 + uVar20 * 2) == *(ulong *)(ringbuffer + uVar20 * 8 + (ulong)uVar37))
      goto code_r0x0010fdcd;
      uVar20 = *(ulong *)(ringbuffer + uVar20 * 8 + (ulong)uVar37) ^ *(ulong *)(piVar2 + uVar20 * 2)
      ;
      uVar30 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
        }
      }
      uVar20 = (uVar30 >> 3 & 0x1fffffff) - lVar27;
      goto LAB_0010fdf7;
    }
    uVar20 = 0;
    piVar14 = piVar2;
    goto joined_r0x0010fe57;
  }
  goto LAB_0010fe36;
code_r0x0010fdcd:
  uVar20 = uVar20 + 1;
  lVar27 = lVar27 + -8;
  if (uVar19 >> 3 == uVar20) goto code_r0x0010fddb;
  goto LAB_0010fdc0;
code_r0x0010fddb:
  uVar20 = -lVar27;
  piVar14 = (int *)((long)piVar2 - lVar27);
joined_r0x0010fe57:
  for (; (uVar30 != 0 && (ringbuffer[uVar20 + uVar37] == (uint8_t)*piVar14)); uVar20 = uVar20 + 1) {
    uVar30 = uVar30 - 1;
    piVar14 = (int *)((long)piVar14 + 1);
  }
LAB_0010fdf7:
  if (3 < uVar20) {
    iVar7 = 0x1f;
    if ((uint)uVar39 != 0) {
      for (; (uint)uVar39 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    uVar30 = (ulong)(iVar7 * -0x1e + 0x780) + uVar20 * 0x87;
    if (uVar36 < uVar30) {
      uVar31 = *(uint8_t *)((long)piVar2 + uVar20);
      uVar36 = uVar30;
      uVar13 = uVar20;
      local_110 = uVar39;
    }
  }
LAB_0010fe36:
  puVar35 = puVar35 + 1;
  iVar28 = iVar28 + 1;
  if (iVar28 == 4) goto LAB_0010fe6e;
  goto LAB_0010fd80;
LAB_0010fe6e:
  iVar28 = 0;
  if ((uVar36 != 0x7e4) || (iVar28 = 0, *(ulong *)(hasher + 0x20) < *(ulong *)(hasher + 0x18) >> 7))
  goto LAB_0010ff01;
  uVar4 = (params->dictionary).hash_table[(ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x12) * 2];
  *(long *)(hasher + 0x18) = *(long *)(hasher + 0x18) + 1;
  if ((ulong)uVar4 == 0) goto LAB_0010ff01;
  uVar32 = uVar4 & 0x1f;
  uVar33 = (ulong)uVar32;
  bVar40 = true;
  iVar28 = 0;
  if (uVar33 <= uVar25) {
    pBVar5 = (params->dictionary).words;
    puVar16 = pBVar5->data + (ulong)pBVar5->offsets_by_length[uVar33] + uVar33 * (uVar4 >> 5);
    if (7 < uVar33) {
      uVar30 = (ulong)(uVar4 & 0x18);
      local_d0 = 0;
      uVar39 = 0;
LAB_0010ffeb:
      if (*(ulong *)(puVar16 + uVar39 * 8) == *(ulong *)(piVar2 + uVar39 * 2))
      goto code_r0x0010fff8;
      uVar30 = *(ulong *)(piVar2 + uVar39 * 2) ^ *(ulong *)(puVar16 + uVar39 * 8);
      uVar39 = 0;
      if (uVar30 != 0) {
        for (; (uVar30 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
        }
      }
      uVar39 = (uVar39 >> 3 & 0x1fffffff) - local_d0;
      goto LAB_00110036;
    }
    uVar30 = 0;
    goto LAB_00110107;
  }
LAB_0010fed4:
  if (!bVar40) {
    *(long *)(hasher + 0x20) = *(long *)(hasher + 0x20) + 1;
  }
LAB_0010ff01:
  *(int *)(hasher + (ulong)((uint)((ulong)(lVar26 * -0x42e1ca5843000000) >> 0x2f) +
                           ((uint)(uVar29 >> 3) & 3)) * 4 + 0x28) = (int)uVar29;
  bVar40 = local_e0 + 0xaf <= uVar36;
  local_98 = uVar17;
  iVar7 = iVar6;
  if (bVar40) {
    local_100 = local_100 + 1;
    local_f0 = local_110;
    local_118 = uVar13;
    local_98 = uVar29;
    local_e4 = iVar28;
    local_e0 = uVar36;
    iVar7 = iVar6 + 1;
  }
  bVar8 = 2 < iVar6;
  uVar13 = uVar17 + 9;
  uVar19 = uVar19 - 1;
  uVar17 = local_98;
  iVar6 = iVar7;
  if (!bVar40 || (bVar8 || uVar23 <= uVar13)) goto LAB_001101c4;
  goto LAB_0010fc3b;
code_r0x0010fff8:
  uVar39 = uVar39 + 1;
  local_d0 = local_d0 + -8;
  if (uVar32 >> 3 == uVar39) goto code_r0x00110006;
  goto LAB_0010ffeb;
code_r0x00110006:
  puVar16 = puVar16 + -local_d0;
LAB_00110107:
  uVar20 = (ulong)uVar4 & 7;
  uVar39 = uVar30;
  if ((uVar4 & 7) != 0) {
    uVar21 = uVar30 | uVar20;
    do {
      uVar39 = uVar30;
      if (*(uint8_t *)((long)piVar2 + uVar30) != *puVar16) break;
      puVar16 = puVar16 + 1;
      uVar30 = uVar30 + 1;
      uVar20 = uVar20 - 1;
      uVar39 = uVar21;
    } while (uVar20 != 0);
  }
LAB_00110036:
  iVar28 = 0;
  bVar40 = true;
  if ((uVar39 != 0) && (bVar40 = true, uVar33 < (params->dictionary).cutoffTransformsCount + uVar39)
     ) {
    uVar24 = uVar24 + 1 + (ulong)(uVar4 >> 5) +
             ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                            ((char)(uVar33 - uVar39) * '\x06' & 0x3fU)) & 0x3f) +
              (uVar33 - uVar39) * 4 << (pBVar5->size_bits_by_length[uVar33] & 0x3f));
    if (uVar15 < uVar24) {
      bVar40 = true;
    }
    else {
      iVar7 = 0x1f;
      if ((uint)uVar24 != 0) {
        for (; (uint)uVar24 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      uVar33 = (uVar39 * 0x87 - (ulong)(uint)(iVar7 * 0x1e)) + 0x780;
      bVar40 = true;
      if (0x7e3 < uVar33) {
        iVar28 = uVar32 - (int)uVar39;
        bVar40 = false;
        uVar36 = uVar33;
        uVar13 = uVar39;
        local_110 = uVar24;
      }
    }
  }
  goto LAB_0010fed4;
LAB_001101c4:
  uVar17 = uVar38;
  if (local_98 < uVar38) {
    uVar17 = local_98;
  }
  if (uVar17 < local_f0) {
LAB_001103b9:
    uVar19 = local_f0 + 0xf;
  }
  else {
    uVar32 = 0;
    bVar40 = false;
    if (local_f0 != (long)*dist_cache) {
      if (local_f0 == (long)dist_cache[1]) {
        uVar32 = 1;
      }
      else {
        uVar19 = (local_f0 + 3) - (long)*dist_cache;
        if (uVar19 < 7) {
          bVar18 = (byte)((int)uVar19 << 2);
          uVar32 = 0x9750468;
        }
        else {
          uVar19 = (local_f0 + 3) - (long)dist_cache[1];
          if (6 < uVar19) {
            if (local_f0 != (long)dist_cache[2]) {
              bVar40 = local_f0 != (long)dist_cache[3];
              uVar32 = 3;
              goto LAB_001103b5;
            }
            uVar32 = 2;
            goto LAB_001103b3;
          }
          bVar18 = (byte)((int)uVar19 << 2);
          uVar32 = 0xfdb1ace;
        }
        uVar32 = uVar32 >> (bVar18 & 0x1f) & 0xf;
      }
LAB_001103b3:
      bVar40 = false;
    }
LAB_001103b5:
    if (bVar40) goto LAB_001103b9;
    uVar19 = (ulong)uVar32;
  }
  if ((local_f0 <= uVar17) && (uVar19 != 0)) {
    dist_cache[3] = dist_cache[2];
    *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
    *dist_cache = (int)local_f0;
  }
  uVar32 = (uint)local_100;
  local_c0->insert_len_ = uVar32;
  local_c0->copy_len_ = local_e4 << 0x19 | (uint)local_118;
  uVar25 = (ulong)(params->dist).num_direct_distance_codes;
  uVar17 = uVar25 + 0x10;
  if (uVar19 < uVar17) {
    local_c0->dist_prefix_ = (uint16_t)uVar19;
    uVar10 = 0;
  }
  else {
    uVar10 = (params->dist).distance_postfix_bits;
    bVar18 = (byte)uVar10;
    uVar19 = ((uVar19 - uVar25) + (4L << (bVar18 & 0x3f))) - 0x10;
    uVar37 = 0x1f;
    if ((uint)uVar19 != 0) {
      for (; (uint)uVar19 >> uVar37 == 0; uVar37 = uVar37 - 1) {
      }
    }
    uVar37 = (uVar37 ^ 0xffffffe0) + 0x1f;
    bVar40 = (uVar19 >> ((ulong)uVar37 & 0x3f) & 1) != 0;
    iVar22 = uVar37 - uVar10;
    local_c0->dist_prefix_ =
         (short)((uint)bVar40 + iVar22 * 2 + 0xfffe << (bVar18 & 0x3f)) +
         (short)uVar17 + (~(ushort)(-1 << (bVar18 & 0x1f)) & (ushort)uVar19) | (short)iVar22 * 0x400
    ;
    uVar10 = (uint32_t)(uVar19 - ((ulong)bVar40 + 2 << ((byte)uVar37 & 0x3f)) >> (bVar18 & 0x3f));
  }
  local_c0->dist_extra_ = uVar10;
  if (5 < local_100) {
    if (local_100 < 0x82) {
      uVar32 = 0x1f;
      uVar37 = (uint)(local_100 - 2);
      if (uVar37 != 0) {
        for (; uVar37 >> uVar32 == 0; uVar32 = uVar32 - 1) {
        }
      }
      uVar32 = (int)(local_100 - 2 >> ((char)(uVar32 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar32 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_100 < 0x842) {
      uVar37 = 0x1f;
      if (uVar32 - 0x42 != 0) {
        for (; uVar32 - 0x42 >> uVar37 == 0; uVar37 = uVar37 - 1) {
        }
      }
      uVar32 = (uVar37 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar32 = 0x15;
      if (0x1841 < local_100) {
        uVar32 = (uint)(ushort)(0x17 - (local_100 < 0x5842));
      }
    }
  }
  uVar37 = local_e4 + (uint)local_118;
  if (uVar37 < 10) {
    uVar11 = uVar37 - 2;
  }
  else if (uVar37 < 0x86) {
    uVar37 = uVar37 - 6;
    uVar11 = 0x1f;
    if (uVar37 != 0) {
      for (; uVar37 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uVar11 = (int)((ulong)(long)(int)uVar37 >> ((char)(uVar11 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar11 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar11 = 0x17;
    if (uVar37 < 0x846) {
      uVar11 = 0x1f;
      if (uVar37 - 0x46 != 0) {
        for (; uVar37 - 0x46 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar11 = (uVar11 ^ 0xffe0) + 0x2c;
    }
  }
  uVar4 = (ushort)uVar11;
  uVar9 = (uVar4 & 7) + ((ushort)uVar32 & 7) * 8;
  if ((((local_c0->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar32 < 8)) && (uVar4 < 0x10)) {
    if (7 < uVar4) {
      uVar9 = uVar9 | 0x40;
    }
  }
  else {
    iVar22 = ((uVar32 & 0xffff) >> 3) * 3 + ((uVar11 & 0xffff) >> 3);
    uVar9 = uVar9 + ((ushort)(0x520d40 >> ((char)iVar22 * '\x02' & 0x1fU)) & 0xc0) +
                    (short)iVar22 * 0x40 + 0x40;
  }
  local_c0->cmd_prefix_ = uVar9;
  *num_literals = *num_literals + local_100;
  position = local_98 + local_118;
  uVar17 = uVar12;
  if (position < uVar12) {
    uVar17 = position;
  }
  uVar19 = local_98 + 2;
  if (local_f0 < local_118 >> 2) {
    uVar25 = position + local_f0 * -4;
    if (uVar25 < uVar19) {
      uVar25 = uVar19;
    }
    uVar19 = uVar25;
    if (uVar17 < uVar25) {
      uVar19 = uVar17;
    }
  }
  local_98 = lVar34 + local_118 * 2 + local_98;
  local_c0 = local_c0 + 1;
  if (uVar19 < uVar17) {
    do {
      *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (uVar19 & ringbuffer_mask)) *
                                              -0x42e1ca5843000000) >> 0x2f) +
                               ((uint)(uVar19 >> 3) & 3)) * 4 + 0x28) = (int)uVar19;
      uVar19 = uVar19 + 1;
    } while (uVar17 != uVar19);
  }
  local_100 = 0;
LAB_00110682:
  uVar17 = position;
  if (uVar23 <= position + 8) goto LAB_001107b0;
  goto LAB_0010f8af;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}